

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.cpp
# Opt level: O0

void __thiscall
gmlc::networking::SocketFactory::parse_json_config(SocketFactory *this,string *conf_str)

{
  bool bVar1;
  long in_RDI;
  bool *in_stack_00000008;
  char (*in_stack_00000010) [10];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_00000018;
  json j;
  bool in_stack_000000be;
  bool in_stack_000000bf;
  parser_callback_t *in_stack_000000c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c8;
  nullptr_t in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  
  CLI::std::
  function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<std::__cxx11::string&>
            (in_stack_000000c8,in_stack_000000c0,in_stack_000000bf,in_stack_000000be);
  CLI::std::
  function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
               *)0x6ecdce);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::value<bool_&,_const_char_(&)[10],_bool,_0>
                    (in_stack_00000018,in_stack_00000010,in_stack_00000008);
  *(bool *)(in_RDI + 0x10) = bVar1;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)CONCAT17(bVar1,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void SocketFactory::parse_json_config(std::string conf_str)
{
    json j = json::parse(conf_str);

    // parse SocketFactory settings; defaults to existing setting if option is
    // not present in the JSON file
    encrypted = j.value("encrypted", encrypted);
#ifdef GMLC_NETWORKING_ENABLE_ENCRYPTION
    password = j.value("password", password);
    use_default_verify_paths =
        j.value("use_default_verify_paths", use_default_verify_paths);
    verify_file = j.value("verify_file", verify_file);
    verify_path = j.value("verify_path", verify_path);
    certificate_chain_file =
        j.value("certificate_chain_file", certificate_chain_file);
    certificate_file = j.value("certificate_file", certificate_file);
    private_key_file = j.value("private_key_file", private_key_file);
    rsa_private_key_file =
        j.value("rsa_private_key_file", rsa_private_key_file);
    tmp_dh_file = j.value("tmp_dh_file", tmp_dh_file);
#endif
}